

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_gga_inc.c
# Opt level: O2

void work_gga_fxc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,xc_gga_out_params *out)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double __x;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  undefined1 auVar178 [16];
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  undefined1 auVar179 [16];
  double dVar184;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  double __x_00;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  undefined1 auVar199 [16];
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  undefined1 auVar223 [16];
  double dVar231;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar250;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  double dVar251;
  double dVar252;
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  double dVar260;
  double dVar261;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  double dVar267;
  double dVar268;
  double dVar269;
  double dVar270;
  double dVar271;
  double dVar272;
  double dVar273;
  double dVar274;
  double dVar275;
  double dVar276;
  undefined1 auVar277 [16];
  double dVar284;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  double dVar285;
  double dVar286;
  double dVar287;
  double dVar288;
  double dVar289;
  double dVar290;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  double dVar295;
  double dVar296;
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  double dVar303;
  double dVar304;
  double dVar305;
  undefined1 auVar306 [16];
  double dVar311;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  double dVar312;
  double dVar313;
  double dVar314;
  double dVar315;
  double dVar316;
  double dVar317;
  double dVar318;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  double dVar324;
  double dVar325;
  double dVar326;
  double dVar327;
  double dVar328;
  double dVar329;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  double dVar335;
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  double dVar336;
  double dVar337;
  double dVar338;
  double dVar339;
  double dVar340;
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  double dVar351;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  double dVar352;
  double dVar353;
  double dVar354;
  double dVar355;
  double dVar356;
  double dVar357;
  double dVar358;
  undefined1 auVar359 [16];
  double dVar361;
  undefined1 auVar360 [16];
  double dVar362;
  double dVar363;
  double dVar372;
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  double dVar373;
  double dVar374;
  double dVar375;
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  double local_d18;
  double local_bd0;
  double local_678;
  double dStack_670;
  double local_608;
  double local_5f8;
  double local_538;
  double dStack_530;
  double local_3f8;
  double local_3e8;
  
  local_d18 = 0.0;
  local_bd0 = 0.0;
  for (sVar10 = 0; np != sVar10; sVar10 = sVar10 + 1) {
    lVar8 = (long)(p->dim).rho * sVar10;
    dVar18 = rho[lVar8];
    if (p->nspin == 2) {
      dVar18 = dVar18 + rho[lVar8 + 1];
    }
    dVar340 = p->dens_threshold;
    if (dVar340 <= dVar18) {
      lVar9 = (long)(p->dim).sigma * sVar10;
      dVar18 = rho[lVar8];
      if (rho[lVar8] <= dVar340) {
        dVar18 = dVar340;
      }
      dVar19 = p->sigma_threshold * p->sigma_threshold;
      dVar124 = sigma[lVar9];
      if (sigma[lVar9] <= dVar19) {
        dVar124 = dVar19;
      }
      if (p->nspin == 2) {
        local_d18 = rho[lVar8 + 1];
        if (rho[lVar8 + 1] <= dVar340) {
          local_d18 = dVar340;
        }
        local_bd0 = sigma[lVar9 + 2];
        if (sigma[lVar9 + 2] <= dVar19) {
          local_bd0 = dVar19;
        }
      }
      pdVar2 = (double *)p->params;
      __x_00 = dVar18 + local_d18;
      dVar142 = 1.0 / __x_00;
      dVar206 = (dVar18 + dVar18) * dVar142;
      dVar19 = p->zeta_threshold;
      dVar185 = dVar19 + -1.0;
      dVar232 = (local_d18 + local_d18) * dVar142;
      dVar20 = dVar18 - local_d18;
      uVar11 = -(ulong)(dVar232 <= dVar19);
      uVar12 = -(ulong)(dVar206 <= dVar19);
      dVar58 = (double)(uVar12 & (ulong)dVar185 |
                       ~uVar12 & (~uVar11 & (ulong)(dVar20 * dVar142) | (ulong)-dVar185 & uVar11));
      dVar84 = dVar58 + 1.0;
      dVar21 = cbrt(dVar19);
      dVar22 = cbrt(dVar84);
      uVar13 = -(ulong)(dVar84 <= dVar19);
      dVar23 = (double)(uVar13 & (ulong)(dVar21 * dVar19) | ~uVar13 & (ulong)(dVar22 * dVar84)) *
               0.9847450218426964;
      dVar24 = cbrt(__x_00);
      dVar85 = pdVar2[2] * dVar124;
      dVar86 = dVar18 * dVar18;
      dVar25 = cbrt(dVar18);
      dVar143 = 1.0 / dVar25;
      dVar87 = 1.0 / (dVar25 * dVar25);
      dVar88 = dVar87 / dVar86;
      dVar186 = pdVar2[3] * dVar124 * dVar124;
      dVar207 = dVar86 * dVar86;
      dVar144 = dVar143 / (dVar18 * dVar207);
      dVar145 = dVar85 * dVar88 + dVar186 * dVar144 + 1.0;
      dVar25 = (-1.0 / dVar145 + 1.0) * pdVar2[1];
      dVar146 = pdVar2[4] * dVar124;
      dVar147 = dVar146 * dVar88 + 1.0;
      dVar89 = -1.0 / dVar147 + 1.0;
      dVar26 = dVar25 * dVar89 + *pdVar2;
      dVar27 = cbrt(0.3183098861837907);
      dVar90 = 1.0 / dVar27;
      dVar91 = dVar90 * 1.5874010519681996 * 6.534776057350833;
      dVar92 = dVar91 / dVar26;
      if (dVar92 < 0.0) {
        dVar28 = sqrt(dVar92);
      }
      else {
        dVar28 = SQRT(dVar92);
      }
      dVar93 = p->cam_omega / dVar28;
      dVar29 = cbrt(__x_00 * dVar84);
      dVar29 = 1.0 / dVar29;
      dVar30 = dVar29 * 1.2599210498948732;
      dVar187 = dVar93 * dVar30 * 0.5;
      dVar148 = 1.35;
      if (dVar187 <= 1.35) {
        dVar148 = dVar187;
      }
      dVar31 = 1.0 / dVar148;
      dVar32 = erf(dVar31 * 0.5);
      dVar94 = dVar148 * dVar148;
      dVar33 = 1.0 / dVar94;
      dVar34 = exp(dVar33 * -0.25);
      dVar318 = dVar187;
      if (dVar187 <= 1.35) {
        dVar318 = 1.35;
      }
      dVar312 = dVar318 * dVar318;
      dVar324 = dVar312 * dVar312;
      dVar251 = 1.0 / (dVar312 * dVar324);
      dVar95 = dVar324 * dVar324;
      auVar277._0_8_ = dVar95 * dVar95;
      auVar277._8_8_ = dVar95;
      auVar277 = divpd(_DAT_00f48900,auVar277);
      dVar267 = auVar277._0_8_;
      dVar284 = auVar277._8_8_;
      auVar306._8_8_ = dVar324;
      auVar306._0_8_ = dVar312;
      auVar69._8_8_ = dVar284;
      auVar69._0_8_ = dVar284;
      auVar306 = divpd(auVar69,auVar306);
      dVar208 = dVar284 / (dVar312 * dVar324);
      dVar95 = dVar34 + -1.0;
      dVar149 = dVar94 * -2.0 * dVar95 + dVar34 + -1.5;
      dVar96 = dVar148 + dVar148;
      dVar32 = dVar96 * dVar149 + dVar32 * 1.7724538509055159;
      dVar150 = 1.0 / dVar324;
      if (dVar187 < 1.35) {
        dVar35 = dVar148 * -2.6666666666666665 * dVar32 + 1.0;
      }
      else {
        auVar125._0_8_ = 1.0 / dVar312;
        auVar125._8_8_ = dVar150;
        auVar69 = divpd(auVar125,_DAT_00f54be0);
        auVar178._8_8_ = dVar284;
        auVar178._0_8_ = dVar251;
        auVar125 = divpd(auVar178,_DAT_00f54bf0);
        auVar178 = divpd(auVar306,_DAT_00f54c00);
        auVar199._8_8_ = dVar267;
        auVar199._0_8_ = dVar208;
        auVar199 = divpd(auVar199,_DAT_00f54c10);
        dVar35 = ((((((auVar69._0_8_ - auVar69._8_8_) + auVar125._0_8_) - auVar125._8_8_) +
                   auVar178._0_8_) - auVar178._8_8_) + auVar199._0_8_) - auVar199._8_8_;
      }
      dVar40 = p->cam_beta;
      dVar41 = p->cam_alpha;
      dVar36 = dVar23 * -0.375;
      dVar1 = p->dens_threshold;
      dVar151 = -dVar20;
      dVar63 = (double)((ulong)dVar185 & uVar11 |
                       ~uVar11 & ((ulong)-dVar185 & uVar12 | ~uVar12 & (ulong)(dVar142 * dVar151)));
      __x = dVar63 + 1.0;
      dVar185 = p->zeta_threshold;
      dVar37 = cbrt(__x);
      uVar14 = -(ulong)(__x <= dVar185);
      dVar21 = (double)((ulong)(dVar21 * dVar19) & uVar14 | ~uVar14 & (ulong)(__x * dVar37)) *
               0.9847450218426964;
      dVar97 = pdVar2[2] * local_bd0;
      dVar98 = local_d18 * local_d18;
      dVar38 = cbrt(local_d18);
      dVar188 = 1.0 / dVar38;
      dVar152 = 1.0 / (dVar38 * dVar38);
      dVar153 = dVar152 / dVar98;
      dVar209 = pdVar2[3] * local_bd0 * local_bd0;
      dVar233 = dVar98 * dVar98;
      dVar189 = dVar188 / (local_d18 * dVar233);
      dVar190 = dVar97 * dVar153 + dVar209 * dVar189 + 1.0;
      dVar191 = (1.0 - 1.0 / dVar190) * pdVar2[1];
      dVar38 = pdVar2[4] * local_bd0;
      dVar210 = dVar38 * dVar153 + 1.0;
      dVar154 = 1.0 - 1.0 / dVar210;
      dVar192 = dVar191 * dVar154 + *pdVar2;
      dVar91 = dVar91 / dVar192;
      if (dVar91 < 0.0) {
        dVar155 = sqrt(dVar91);
      }
      else {
        dVar155 = SQRT(dVar91);
      }
      dVar39 = dVar24 * dVar26;
      dVar40 = (-dVar40 * dVar35 - dVar41) + 1.0;
      dVar41 = p->cam_omega / dVar155;
      dVar42 = cbrt(__x_00 * __x);
      dVar42 = 1.0 / dVar42;
      dVar43 = dVar42 * 1.2599210498948732;
      dVar156 = dVar41 * dVar43 * 0.5;
      dVar35 = 1.35;
      if (dVar156 <= 1.35) {
        dVar35 = dVar156;
      }
      dVar44 = 1.0 / dVar35;
      dVar45 = erf(dVar44 * 0.5);
      dVar99 = dVar35 * dVar35;
      dVar46 = 1.0 / dVar99;
      dVar47 = exp(dVar46 * -0.25);
      dVar54 = dVar156;
      if (dVar156 <= 1.35) {
        dVar54 = 1.35;
      }
      dVar352 = dVar54 * dVar54;
      dVar362 = dVar352 * dVar352;
      dVar211 = 1.0 / (dVar352 * dVar362);
      dVar100 = dVar362 * dVar362;
      auVar201._0_8_ = dVar100 * dVar100;
      auVar201._8_8_ = dVar100;
      auVar69 = divpd(_DAT_00f48900,auVar201);
      dVar234 = auVar69._0_8_;
      dVar250 = auVar69._8_8_;
      auVar179._8_8_ = dVar362;
      auVar179._0_8_ = dVar352;
      auVar330._8_8_ = dVar250;
      auVar330._0_8_ = dVar250;
      auVar125 = divpd(auVar330,auVar179);
      dVar295 = dVar250 / (dVar352 * dVar362);
      dVar157 = dVar47 + -1.0;
      dVar101 = dVar99 * -2.0 * dVar157 + dVar47 + -1.5;
      dVar100 = dVar35 + dVar35;
      dVar285 = dVar45 * 1.7724538509055159 + dVar100 * dVar101;
      dVar45 = 1.0 / dVar362;
      if (dVar156 < 1.35) {
        dVar48 = dVar35 * -2.6666666666666665 * dVar285 + 1.0;
      }
      else {
        auVar70._0_8_ = 1.0 / dVar352;
        auVar70._8_8_ = dVar45;
        auVar178 = divpd(auVar70,_DAT_00f54be0);
        auVar126._8_8_ = dVar250;
        auVar126._0_8_ = dVar211;
        auVar199 = divpd(auVar126,_DAT_00f54bf0);
        auVar179 = divpd(auVar125,_DAT_00f54c00);
        auVar200._8_8_ = dVar234;
        auVar200._0_8_ = dVar295;
        auVar201 = divpd(auVar200,_DAT_00f54c10);
        dVar48 = ((((((auVar178._0_8_ - auVar178._8_8_) + auVar199._0_8_) - auVar199._8_8_) +
                   auVar179._0_8_) - auVar179._8_8_) + auVar201._0_8_) - auVar201._8_8_;
      }
      dVar193 = dVar39 * dVar40;
      uVar15 = -(ulong)(dVar18 <= dVar340);
      dVar102 = dVar24 * dVar192;
      dVar194 = (-p->cam_beta * dVar48 - p->cam_alpha) + 1.0;
      dVar103 = dVar102 * dVar194;
      dVar48 = dVar21 * -0.375;
      uVar16 = -(ulong)(local_d18 <= dVar1);
      dVar104 = (double)(~uVar16 & (ulong)(dVar48 * dVar103)) +
                (double)(~uVar15 & (ulong)(dVar36 * dVar193));
      pdVar3 = out->zk;
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
        lVar8 = (long)(p->dim).zk * sVar10;
        pdVar3[lVar8] = pdVar3[lVar8] + dVar104;
      }
      dVar105 = __x_00 * __x_00;
      dVar49 = 1.0 / dVar105;
      bVar4 = dVar19 < dVar232;
      bVar5 = dVar19 < dVar206;
      dVar296 = 0.0;
      if (bVar5 && bVar4) {
        dVar296 = dVar142 - dVar20 * dVar49;
      }
      dVar353 = 1.0 / (dVar24 * dVar24);
      dVar158 = pdVar2[1] / (dVar145 * dVar145);
      dVar268 = dVar87 / (dVar18 * dVar86);
      dVar106 = dVar143 / (dVar86 * dVar207);
      dVar235 = dVar85 * -2.6666666666666665 * dVar268 + dVar186 * -5.333333333333333 * dVar106;
      dVar107 = 1.0 / (dVar147 * dVar147);
      dVar236 = dVar235 * dVar89 * dVar158 +
                dVar107 * dVar25 * -2.6666666666666665 * dVar146 * dVar268;
      auVar291._0_8_ = dVar324 * dVar318;
      auVar291._8_8_ = dVar312 * dVar318;
      dVar92 = (p->cam_omega / dVar28) / dVar92;
      dVar108 = dVar30 * dVar92 * 3.141592653589793;
      dVar50 = dVar90 * 2.080083823051904;
      dVar313 = dVar26 * dVar26;
      dVar159 = 1.0 / dVar313;
      dVar160 = dVar159 * 1.5874010519681996;
      dVar269 = (dVar29 / (__x_00 * dVar84)) * 1.2599210498948732;
      dVar297 = dVar296 * __x_00 + dVar58 + 1.0;
      dVar51 = dVar50 * dVar108;
      dVar298 = (dVar297 * dVar93 * dVar269) / -6.0 + dVar160 * dVar236 * dVar51 * 0.25;
      auVar278._8_8_ = dVar324 * auVar291._8_8_;
      auVar278._0_8_ = dVar318;
      dVar109 = dVar22 * 1.3333333333333333;
      dVar354 = dVar353 * dVar26;
      dVar324 = dVar354 * dVar40;
      dVar355 = dVar23 * dVar324 * 0.125;
      uVar17 = -(ulong)(1.35 < dVar187);
      dVar212 = (double)(uVar17 & (ulong)dVar298);
      auVar223._8_8_ = 0x3ff0000000000000;
      auVar223._0_8_ = dVar284;
      dVar318 = 0.0;
      if (dVar187 <= 1.35) {
        dVar318 = dVar298;
      }
      dVar325 = 1.0 / auVar291._8_8_;
      dVar298 = 1.0 / auVar291._0_8_;
      auVar178 = divpd(auVar223,auVar278);
      auVar6._8_8_ = dVar284;
      auVar6._0_8_ = dVar284;
      auVar199 = divpd(auVar6,auVar291);
      dVar311 = auVar199._8_8_;
      auVar277 = divpd(auVar277,auVar278);
      dVar213 = auVar178._0_8_;
      dVar231 = auVar178._8_8_;
      dVar237 = 1.0 / (dVar148 * dVar94);
      dVar252 = dVar95 * dVar148 * -4.0;
      dVar270 = (dVar252 * dVar318 + dVar237 * dVar318 * dVar34 * 0.5) - dVar318 * dVar31 * dVar34;
      dVar253 = dVar318 + dVar318;
      dVar271 = -dVar34 * dVar33;
      dVar272 = dVar271 * dVar318 + dVar96 * dVar270 + dVar149 * dVar253;
      dVar184 = auVar277._8_8_;
      dVar299 = auVar199._0_8_;
      dVar161 = auVar277._0_8_;
      if (dVar187 < 1.35) {
        dVar238 = dVar148 * -2.6666666666666665 * dVar272 + dVar318 * -2.6666666666666665 * dVar32;
      }
      else {
        auVar331._0_8_ = -dVar325 * dVar212;
        auVar331._8_8_ = dVar298 * dVar212;
        auVar179 = divpd(auVar331,_DAT_00f54c20);
        auVar262._0_8_ = dVar213 * dVar212;
        auVar262._8_8_ = dVar231 * dVar212;
        auVar277 = divpd(auVar262,_DAT_00f54c30);
        auVar307._0_8_ = dVar299 * dVar212;
        auVar307._8_8_ = dVar311 * dVar212;
        auVar199 = divpd(auVar307,_DAT_00f54c40);
        auVar292._0_8_ = dVar212 * dVar161;
        auVar292._8_8_ = dVar212 * dVar184;
        auVar178 = divpd(auVar292,_DAT_00f54c50);
        dVar238 = ((((((auVar179._8_8_ + auVar179._0_8_) - auVar277._8_8_) + auVar277._0_8_) -
                    auVar199._8_8_) + auVar199._0_8_) - auVar178._8_8_) + auVar178._0_8_;
      }
      dVar195 = (double)(~uVar13 & (ulong)(dVar109 * dVar296 * 0.9847450218426964));
      dVar110 = dVar24 * dVar236;
      dVar196 = dVar40 * dVar110;
      dVar238 = dVar238 * p->cam_beta;
      dVar111 = dVar39 * dVar238;
      dVar239 = 0.0;
      dVar273 = 0.0;
      if (dVar340 < dVar18) {
        dVar273 = dVar23 * 0.375 * dVar111 +
                  ((dVar195 * -0.375 * dVar193 - dVar355) - dVar23 * 0.375 * dVar196);
      }
      if (dVar19 < dVar232) {
        dVar239 = (double)(~uVar12 & (ulong)(-dVar142 - dVar49 * dVar151));
      }
      dVar314 = dVar37 * 1.3333333333333333;
      dVar232 = dVar353 * dVar192;
      dVar52 = dVar232 * dVar194;
      dVar300 = dVar21 * dVar52 * 0.125;
      auVar127._0_8_ = dVar362 * dVar54;
      auVar127._8_8_ = dVar352 * dVar54;
      dVar53 = (dVar42 / (__x_00 * __x)) * 1.2599210498948732;
      dVar162 = dVar239 * __x_00 + dVar63 + 1.0;
      dVar254 = dVar41 * dVar53;
      dVar255 = (dVar254 * dVar162) / -6.0;
      local_608 = dVar255;
      if (dVar156 <= 1.35) {
        local_608 = 0.0;
      }
      dVar163 = 1.0 / auVar127._8_8_;
      dVar240 = 1.0 / auVar127._0_8_;
      auVar332._8_8_ = 0x3ff0000000000000;
      auVar332._0_8_ = dVar250;
      auVar341._8_8_ = dVar362 * auVar127._8_8_;
      auVar341._0_8_ = dVar54;
      auVar178 = divpd(auVar332,auVar341);
      dVar335 = auVar178._8_8_;
      auVar7._8_8_ = dVar250;
      auVar7._0_8_ = dVar250;
      auVar199 = divpd(auVar7,auVar127);
      dVar372 = auVar199._8_8_;
      auVar277 = divpd(auVar69,auVar341);
      uVar12 = -(ulong)(1.35 < dVar156);
      dVar255 = (double)(~uVar12 & (ulong)dVar255);
      dVar286 = 1.0 / (dVar35 * dVar99);
      dVar214 = dVar157 * dVar35 * -4.0;
      dVar287 = (dVar214 * dVar255 + dVar286 * dVar255 * dVar47 * 0.5) - dVar255 * dVar44 * dVar47;
      dVar215 = dVar255 + dVar255;
      dVar256 = -dVar47 * dVar46;
      dVar288 = dVar255 * dVar256 + dVar100 * dVar287 + dVar101 * dVar215;
      dVar362 = auVar277._8_8_;
      dVar326 = auVar178._0_8_;
      dVar363 = auVar199._0_8_;
      dVar54 = auVar277._0_8_;
      if (dVar156 < 1.35) {
        dVar112 = dVar35 * -2.6666666666666665 * dVar288 + dVar255 * -2.6666666666666665 * dVar285;
      }
      else {
        auVar180._0_8_ = -dVar163 * local_608;
        auVar180._8_8_ = dVar240 * local_608;
        auVar277 = divpd(auVar180,_DAT_00f54c20);
        auVar333._0_8_ = dVar326 * local_608;
        auVar333._8_8_ = dVar335 * local_608;
        auVar69 = divpd(auVar333,_DAT_00f54c30);
        auVar364._0_8_ = dVar363 * local_608;
        auVar364._8_8_ = dVar372 * local_608;
        auVar199 = divpd(auVar364,_DAT_00f54c40);
        auVar342._0_8_ = local_608 * dVar54;
        auVar342._8_8_ = local_608 * dVar362;
        auVar178 = divpd(auVar342,_DAT_00f54c50);
        dVar112 = ((((((auVar277._8_8_ + auVar277._0_8_) - auVar69._8_8_) + auVar69._0_8_) -
                    auVar199._8_8_) + auVar199._0_8_) - auVar178._8_8_) + auVar178._0_8_;
      }
      dVar55 = (double)(~uVar14 & (ulong)(dVar314 * dVar239 * 0.9847450218426964));
      dVar112 = p->cam_beta * dVar112;
      dVar56 = dVar102 * dVar112;
      dVar164 = 0.0;
      if (dVar1 < local_d18) {
        dVar164 = dVar21 * 0.375 * dVar56 + (dVar55 * -0.375 * dVar103 - dVar300);
      }
      pdVar3 = out->vrho;
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar8 = (long)(p->dim).vrho * sVar10;
        pdVar3[lVar8] = __x_00 * (dVar273 + dVar164) + dVar104 + pdVar3[lVar8];
      }
      dVar57 = 0.0;
      if (dVar19 < dVar206) {
        dVar57 = (double)(~uVar11 & (ulong)(-dVar142 - dVar20 * dVar49));
      }
      dVar58 = dVar57 * __x_00 + dVar58 + 1.0;
      dVar206 = (dVar93 * dVar269 * dVar58) / -6.0;
      local_5f8 = dVar206;
      if (dVar187 <= 1.35) {
        local_5f8 = 0.0;
      }
      dVar31 = -dVar31;
      dVar206 = (double)(~uVar17 & (ulong)dVar206);
      dVar327 = dVar206 * dVar31 * dVar34 + dVar252 * dVar206 + dVar237 * dVar206 * dVar34 * 0.5;
      dVar59 = dVar206 + dVar206;
      dVar315 = dVar96 * dVar327 + dVar149 * dVar59 + dVar271 * dVar206;
      if (dVar187 < 1.35) {
        dVar60 = dVar148 * -2.6666666666666665 * dVar315 + dVar206 * -2.6666666666666665 * dVar32;
      }
      else {
        auVar224._0_8_ = -dVar325 * local_5f8;
        auVar224._8_8_ = dVar298 * local_5f8;
        auVar277 = divpd(auVar224,_DAT_00f54c20);
        auVar263._0_8_ = dVar213 * local_5f8;
        auVar263._8_8_ = dVar231 * local_5f8;
        auVar69 = divpd(auVar263,_DAT_00f54c30);
        auVar343._0_8_ = dVar299 * local_5f8;
        auVar343._8_8_ = dVar311 * local_5f8;
        auVar199 = divpd(auVar343,_DAT_00f54c40);
        auVar319._0_8_ = local_5f8 * dVar161;
        auVar319._8_8_ = local_5f8 * dVar184;
        auVar178 = divpd(auVar319,_DAT_00f54c50);
        dVar60 = ((((((auVar277._8_8_ + auVar277._0_8_) - auVar69._8_8_) + auVar69._0_8_) -
                   auVar199._8_8_) + auVar199._0_8_) - auVar178._8_8_) + auVar178._0_8_;
      }
      dVar216 = (double)(~uVar13 & (ulong)(dVar109 * dVar57 * 0.9847450218426964));
      dVar60 = dVar60 * p->cam_beta;
      dVar165 = dVar39 * dVar60;
      dVar197 = 0.0;
      if (dVar340 < dVar18) {
        dVar197 = dVar23 * 0.375 * dVar165 + (dVar216 * -0.375 * dVar193 - dVar355);
      }
      dVar355 = 0.0;
      if (bVar5 && bVar4) {
        dVar355 = dVar142 - dVar49 * dVar151;
      }
      dVar217 = pdVar2[1] / (dVar190 * dVar190);
      dVar166 = dVar152 / (local_d18 * dVar98);
      dVar61 = dVar188 / (dVar98 * dVar233);
      dVar257 = dVar97 * -2.6666666666666665 * dVar166 + dVar209 * -5.333333333333333 * dVar61;
      dVar258 = 1.0 / (dVar210 * dVar210);
      dVar62 = dVar257 * dVar154 * dVar217 +
               dVar258 * dVar191 * -2.6666666666666665 * dVar38 * dVar166;
      dVar91 = (p->cam_omega / dVar155) / dVar91;
      dVar113 = dVar43 * dVar91 * 3.141592653589793;
      dVar167 = dVar192 * dVar192;
      dVar373 = 1.0 / dVar167;
      dVar168 = dVar355 * __x_00 + dVar63 + 1.0;
      dVar218 = dVar50 * dVar113;
      dVar374 = dVar373 * 1.5874010519681996 * dVar218;
      dVar63 = (dVar168 * dVar254) / -6.0 + dVar62 * dVar374 * 0.25;
      dVar142 = 0.0;
      if (dVar156 <= 1.35) {
        dVar142 = dVar63;
      }
      dVar44 = -dVar44;
      dVar63 = (double)((ulong)dVar63 & uVar12);
      dVar169 = dVar142 * dVar44 * dVar47 + dVar214 * dVar142 + dVar286 * dVar142 * dVar47 * 0.5;
      dVar259 = dVar142 + dVar142;
      dVar219 = dVar256 * dVar142 + dVar100 * dVar169 + dVar101 * dVar259;
      if (dVar156 < 1.35) {
        dVar316 = dVar35 * -2.6666666666666665 * dVar219 + dVar142 * -2.6666666666666665 * dVar285;
      }
      else {
        auVar225._0_8_ = -dVar163 * dVar63;
        auVar225._8_8_ = dVar240 * dVar63;
        auVar69 = divpd(auVar225,_DAT_00f54c20);
        auVar264._0_8_ = dVar326 * dVar63;
        auVar264._8_8_ = dVar335 * dVar63;
        auVar178 = divpd(auVar264,_DAT_00f54c30);
        auVar359._0_8_ = dVar363 * dVar63;
        auVar359._8_8_ = dVar372 * dVar63;
        auVar199 = divpd(auVar359,_DAT_00f54c40);
        auVar71._0_8_ = dVar63 * dVar54;
        auVar71._8_8_ = dVar63 * dVar362;
        auVar277 = divpd(auVar71,_DAT_00f54c50);
        dVar316 = ((((((auVar69._8_8_ + auVar69._0_8_) - auVar178._8_8_) + auVar178._0_8_) -
                    auVar199._8_8_) + auVar199._0_8_) - auVar277._8_8_) + auVar277._0_8_;
      }
      dVar220 = (double)(~uVar14 & (ulong)(dVar355 * dVar314 * 0.9847450218426964));
      dVar114 = dVar24 * dVar62;
      dVar170 = dVar194 * dVar114;
      dVar316 = p->cam_beta * dVar316;
      dVar274 = dVar102 * dVar316;
      dVar64 = 0.0;
      if (dVar1 < local_d18) {
        dVar64 = dVar21 * 0.375 * dVar274 +
                 ((dVar220 * -0.375 * dVar103 - dVar300) - dVar21 * 0.375 * dVar170);
      }
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar8 = (long)(p->dim).vrho * sVar10;
        pdVar3[lVar8 + 1] = (dVar197 + dVar64) * __x_00 + dVar104 + pdVar3[lVar8 + 1];
      }
      dVar104 = pdVar2[2];
      dVar300 = pdVar2[3];
      dVar115 = dVar124 * dVar300;
      dVar301 = dVar104 * dVar88 + (dVar115 + dVar115) * dVar144;
      dVar65 = pdVar2[4];
      dVar275 = dVar107 * dVar65;
      dVar88 = dVar88 * dVar275;
      dVar221 = dVar158 * dVar89 * dVar301 + dVar25 * dVar88;
      dVar116 = dVar160 * dVar51;
      dVar117 = dVar116 * dVar221 * 0.25;
      local_3f8 = dVar117;
      if (dVar187 <= 1.35) {
        local_3f8 = 0.0;
      }
      dVar117 = (double)(~uVar17 & (ulong)dVar117);
      dVar317 = dVar117 * dVar31 * dVar34 + dVar252 * dVar117 + dVar237 * dVar117 * dVar34 * 0.5;
      dVar171 = dVar117 + dVar117;
      dVar222 = dVar96 * dVar317 + dVar149 * dVar171 + dVar271 * dVar117;
      if (dVar187 < 1.35) {
        dVar119 = dVar117 * -2.6666666666666665 * dVar32;
        dVar172 = dVar148 * -2.6666666666666665 * dVar222;
      }
      else {
        auVar128._0_8_ = dVar161 * local_3f8;
        auVar128._8_8_ = dVar184 * local_3f8;
        auVar308._0_8_ = dVar299 * local_3f8;
        auVar308._8_8_ = dVar311 * local_3f8;
        auVar265._0_8_ = dVar213 * local_3f8;
        auVar265._8_8_ = dVar231 * local_3f8;
        auVar320._0_8_ = -dVar325 * local_3f8;
        auVar320._8_8_ = dVar298 * local_3f8;
        auVar199 = divpd(auVar320,_DAT_00f54c20);
        auVar69 = divpd(auVar265,_DAT_00f54c30);
        auVar178 = divpd(auVar308,_DAT_00f54c40);
        auVar277 = divpd(auVar128,_DAT_00f54c50);
        dVar119 = auVar277._0_8_;
        dVar172 = (((((auVar199._8_8_ + auVar199._0_8_) - auVar69._8_8_) + auVar69._0_8_) -
                   auVar178._8_8_) + auVar178._0_8_) - auVar277._8_8_;
      }
      dVar118 = dVar24 * dVar221;
      dVar260 = dVar40 * dVar118;
      dVar173 = (dVar172 + dVar119) * p->cam_beta;
      dVar198 = dVar39 * dVar173;
      dVar119 = dVar23 * 0.375;
      dVar172 = (double)(~uVar15 & (ulong)(dVar36 * dVar260 + dVar119 * dVar198));
      pdVar3 = out->vsigma;
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar8 = (long)(p->dim).vsigma * sVar10;
        dVar104 = (pdVar3 + lVar8)[1];
        pdVar3[lVar8] = __x_00 * dVar172 + pdVar3[lVar8];
        (pdVar3 + lVar8)[1] = dVar104 + 0.0;
        dVar104 = pdVar2[2];
        dVar300 = pdVar2[3];
        dVar65 = pdVar2[4];
      }
      dVar300 = dVar300 * local_bd0;
      dVar336 = dVar104 * dVar153 + (dVar300 + dVar300) * dVar189;
      dVar65 = dVar65 * dVar258;
      dVar153 = dVar153 * dVar65;
      dVar174 = dVar191 * dVar153 + dVar217 * dVar154 * dVar336;
      dVar104 = dVar374 * dVar174 * 0.25;
      local_3e8 = dVar104;
      if (dVar156 <= 1.35) {
        local_3e8 = 0.0;
      }
      dVar104 = (double)(~uVar12 & (ulong)dVar104);
      dVar241 = dVar104 * dVar44 * dVar47 + dVar214 * dVar104 + dVar286 * dVar104 * dVar47 * 0.5;
      dVar261 = dVar104 + dVar104;
      dVar328 = dVar100 * dVar241 + dVar101 * dVar261 + dVar256 * dVar104;
      if (dVar156 < 1.35) {
        dVar67 = dVar104 * -2.6666666666666665 * dVar285;
        dVar289 = dVar35 * -2.6666666666666665 * dVar328;
      }
      else {
        auVar129._0_8_ = dVar54 * local_3e8;
        auVar129._8_8_ = dVar362 * local_3e8;
        auVar309._0_8_ = dVar363 * local_3e8;
        auVar309._8_8_ = dVar372 * local_3e8;
        auVar266._0_8_ = dVar326 * local_3e8;
        auVar266._8_8_ = dVar335 * local_3e8;
        auVar321._0_8_ = -dVar163 * local_3e8;
        auVar321._8_8_ = dVar240 * local_3e8;
        auVar199 = divpd(auVar321,_DAT_00f54c20);
        auVar69 = divpd(auVar266,_DAT_00f54c30);
        auVar178 = divpd(auVar309,_DAT_00f54c40);
        auVar277 = divpd(auVar129,_DAT_00f54c50);
        dVar67 = auVar277._0_8_;
        dVar289 = (((((auVar199._8_8_ + auVar199._0_8_) - auVar69._8_8_) + auVar69._0_8_) -
                   auVar178._8_8_) + auVar178._0_8_) - auVar277._8_8_;
      }
      dVar66 = dVar24 * dVar174;
      dVar175 = dVar194 * dVar66;
      dVar290 = (dVar289 + dVar67) * p->cam_beta;
      dVar67 = dVar102 * dVar290;
      dVar120 = dVar21 * 0.375;
      dVar289 = (double)(~uVar16 & (ulong)(dVar48 * dVar175 + dVar120 * dVar67));
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar8 = (long)(p->dim).vsigma * sVar10;
        pdVar3[lVar8 + 2] = __x_00 * dVar289 + pdVar3[lVar8 + 2];
      }
      dVar176 = 1.0 / (__x_00 * dVar105);
      dVar20 = dVar20 * dVar176;
      dVar20 = dVar20 + dVar20;
      dVar49 = dVar49 + dVar49;
      dVar329 = 0.0;
      if (bVar5 && bVar4) {
        dVar329 = dVar20 - dVar49;
      }
      dVar22 = 1.0 / (dVar22 * dVar22);
      dVar302 = -0.0;
      if (dVar19 < dVar84) {
        dVar302 = (dVar109 * dVar329 + dVar22 * 0.4444444444444444 * dVar296 * dVar296) *
                  0.9847450218426964 * -0.375;
      }
      dVar303 = (dVar143 / dVar207) / (dVar18 * dVar86);
      dVar242 = ((pdVar2[1] / (dVar145 * dVar145)) / dVar145) * -2.0;
      dVar86 = dVar124 * dVar275 * dVar268;
      dVar145 = dVar25 * (dVar107 / dVar147);
      dVar143 = pdVar2[4] * pdVar2[4];
      dVar356 = dVar146 * dVar107 * dVar25 * 9.777777777777779 * (dVar87 / dVar207) +
                dVar145 * -14.222222222222221 * dVar124 * dVar124 * dVar143 * dVar303 +
                dVar235 * dVar158 * -5.333333333333333 * dVar86 +
                dVar235 * dVar235 * dVar89 * dVar242 +
                (dVar85 * 9.777777777777779 * (dVar87 / dVar207) +
                dVar186 * 33.77777777777778 * dVar303) * dVar158 * dVar89;
      dVar186 = 1.0 / (dVar27 * dVar27);
      dVar85 = dVar186 * 2.519842099789747;
      dVar186 = dVar186 * 1.4422495703074083;
      dVar87 = 1.0 / (dVar313 * dVar313);
      dVar337 = 1.0 / (dVar26 * dVar313);
      dVar146 = dVar87 * 2.519842099789747;
      dVar313 = dVar269 * dVar92 * 3.141592653589793;
      dVar50 = dVar50 * 1.5874010519681996;
      dVar30 = dVar30 * (((((p->cam_omega / dVar28) / 14.234432706575232) / dVar85) / dVar159) / 3.0
                        ) * 9.869604401089358 * 1.125;
      dVar207 = dVar186 * dVar30;
      dVar28 = dVar337 * 1.5874010519681996;
      dVar303 = (dVar29 / (dVar84 * dVar84)) / dVar105;
      dVar304 = dVar303 * 1.2599210498948732;
      dVar27 = ((dVar329 * __x_00 + dVar296 + dVar296) * dVar93 * dVar269) / -6.0 +
               dVar93 * 0.2222222222222222 * dVar304 * dVar297 * dVar297 +
               dVar160 * dVar356 * dVar51 * 0.25 +
               dVar236 * dVar236 * dVar28 * dVar51 * -0.5 +
               dVar146 * dVar236 * dVar236 * dVar207 +
               (dVar159 * dVar236 * dVar50 * dVar297 * dVar313) / -6.0;
      dVar312 = dVar267 / dVar312;
      dVar375 = 1.0 / (dVar94 * dVar94);
      dVar94 = dVar375 / dVar94;
      dVar329 = ((dVar353 / __x_00) * dVar26 * dVar40 * dVar23) / 12.0;
      dVar29 = dVar375 * -2.0;
      dVar26 = dVar34 * dVar237 + dVar34 * dVar237;
      local_678 = auVar306._0_8_;
      dStack_670 = auVar306._8_8_;
      if (dVar187 < 1.35) {
        dVar27 = (double)(~uVar17 & (ulong)dVar27);
        dVar68 = dVar318 * dVar318;
        dVar27 = dVar148 * -2.6666666666666665 *
                 ((dVar27 * dVar31 * dVar34 +
                  dVar252 * dVar27 +
                  ((dVar68 * -4.0 * dVar95 +
                   dVar94 * dVar68 * dVar34 * 0.25 +
                   dVar29 * dVar68 * dVar34 + dVar237 * dVar27 * dVar34 * 0.5) -
                  dVar68 * dVar33 * dVar34)) * dVar96 +
                 dVar318 * 4.0 * dVar270 +
                 (dVar27 + dVar27) * dVar149 +
                 dVar271 * dVar27 + (dVar26 * dVar68 - dVar68 * (dVar375 / dVar148) * dVar34 * 0.5))
                 + dVar27 * -2.6666666666666665 * dVar32 + dVar318 * -5.333333333333333 * dVar272;
      }
      else {
        dVar68 = dVar212 * dVar212;
        dVar27 = (double)((ulong)dVar27 & uVar17);
        auVar322._0_8_ = dVar284 * dVar68;
        auVar322._8_8_ = dVar231 * dVar27;
        auVar69 = divpd(auVar322,_DAT_00f54c60);
        auVar344._0_8_ = dVar213 * dVar27;
        auVar344._8_8_ = local_678 * dVar68;
        auVar178 = divpd(auVar344,_DAT_00f54c70);
        auVar365._0_8_ = dStack_670 * dVar68;
        auVar365._8_8_ = dVar311 * dVar27;
        auVar199 = divpd(auVar365,_DAT_00f54c80);
        auVar376._0_8_ = dVar299 * dVar27;
        auVar376._8_8_ = dVar208 * dVar68;
        auVar179 = divpd(auVar376,_DAT_00f54c90);
        auVar130._0_8_ = dVar68 * dVar267;
        auVar130._8_8_ = dVar27 * dVar184;
        auVar306 = divpd(auVar130,_DAT_00f54ca0);
        auVar181._0_8_ = dVar161 * dVar27;
        auVar181._8_8_ = dVar312 * dVar68;
        auVar277 = divpd(auVar181,_DAT_00f54cb0);
        dVar27 = ((((((((((dVar27 * dVar298) / 240.0 +
                          (dVar251 * dVar68) / -48.0 +
                          (dVar325 * dVar27) / -18.0 + (dVar150 * dVar68) / 6.0 + auVar69._0_8_) -
                        auVar69._8_8_) - auVar178._8_8_) + auVar178._0_8_ + auVar199._0_8_) -
                     auVar199._8_8_) - auVar179._8_8_) + auVar179._0_8_ + auVar306._0_8_) -
                  auVar306._8_8_) - auVar277._8_8_) + auVar277._0_8_;
      }
      dVar357 = dVar23 * dVar238 * dVar354;
      dVar361 = dVar23 * dVar353 * dVar236 * dVar40;
      dVar121 = 0.0;
      dVar68 = 0.0;
      if (dVar340 < dVar18) {
        dVar68 = dVar27 * p->cam_beta * dVar39 * dVar119 +
                 dVar23 * 0.75 * dVar110 * dVar238 +
                 ((((dVar195 * 0.75 * dVar111 +
                     ((dVar302 * dVar193 + dVar195 * dVar324 * -0.25) - dVar195 * 0.75 * dVar196) +
                    dVar329) - dVar361 * 0.25) + dVar357 * 0.25) -
                 dVar356 * dVar24 * dVar40 * dVar119);
      }
      dVar176 = dVar176 * dVar151;
      dVar176 = dVar176 + dVar176;
      if (bVar5 && bVar4) {
        dVar121 = dVar49 + dVar176;
      }
      dVar27 = 1.0 / (dVar37 * dVar37);
      dVar37 = -0.0;
      if (dVar185 < __x) {
        dVar37 = (dVar121 * dVar314 + dVar27 * 0.4444444444444444 * dVar239 * dVar239) *
                 0.9847450218426964 * -0.375;
      }
      dVar151 = ((dVar353 / __x_00) * dVar192 * dVar194 * dVar21) / 12.0;
      dVar105 = (dVar42 / (__x * __x)) / dVar105;
      dVar42 = dVar41 * 0.2222222222222222 * dVar105 * 1.2599210498948732;
      dVar121 = dVar162 * dVar162 * dVar42 +
                ((dVar121 * __x_00 + dVar239 + dVar239) * dVar254) / -6.0;
      dVar352 = dVar234 / dVar352;
      dVar302 = 1.0 / (dVar99 * dVar99);
      dVar99 = dVar302 / dVar99;
      dVar356 = dVar302 * -2.0;
      dVar358 = dVar47 * dVar286 + dVar47 * dVar286;
      local_538 = auVar125._0_8_;
      dStack_530 = auVar125._8_8_;
      if (dVar156 < 1.35) {
        dVar121 = (double)(~uVar12 & (ulong)dVar121);
        dVar276 = dVar255 * dVar255;
        dVar338 = dVar121 * -2.6666666666666665 * dVar285 + dVar255 * -5.333333333333333 * dVar288;
        dVar121 = dVar35 * -2.6666666666666665 *
                  ((dVar121 * dVar44 * dVar47 +
                   dVar214 * dVar121 +
                   ((dVar276 * -4.0 * dVar157 +
                    dVar99 * dVar276 * dVar47 * 0.25 +
                    dVar356 * dVar276 * dVar47 + dVar286 * dVar121 * dVar47 * 0.5) -
                   dVar276 * dVar46 * dVar47)) * dVar100 +
                  dVar255 * 4.0 * dVar287 +
                  (dVar121 + dVar121) * dVar101 +
                  dVar256 * dVar121 +
                  (dVar358 * dVar276 - dVar276 * (dVar302 / dVar35) * dVar47 * 0.5));
      }
      else {
        dVar276 = local_608 * local_608;
        dVar121 = (double)((ulong)dVar121 & uVar12);
        auVar334._0_8_ = dVar250 * dVar276;
        auVar334._8_8_ = dVar335 * dVar121;
        auVar199 = divpd(auVar334,_DAT_00f54c60);
        auVar202._0_8_ = dVar326 * dVar121;
        auVar202._8_8_ = local_538 * dVar276;
        auVar277 = divpd(auVar202,_DAT_00f54c70);
        auVar72._0_8_ = dStack_530 * dVar276;
        auVar72._8_8_ = dVar372 * dVar121;
        auVar306 = divpd(auVar72,_DAT_00f54c80);
        auVar279._0_8_ = dVar363 * dVar121;
        auVar279._8_8_ = dVar295 * dVar276;
        auVar178 = divpd(auVar279,_DAT_00f54c90);
        auVar243._0_8_ = dVar276 * dVar234;
        auVar243._8_8_ = dVar121 * dVar362;
        auVar69 = divpd(auVar243,_DAT_00f54ca0);
        auVar244._0_8_ = dVar54 * dVar121;
        auVar244._8_8_ = dVar352 * dVar276;
        auVar125 = divpd(auVar244,_DAT_00f54cb0);
        dVar338 = auVar125._0_8_;
        dVar121 = (((((((((dVar121 * dVar240) / 240.0 +
                          (dVar211 * dVar276) / -48.0 +
                          (dVar163 * dVar121) / -18.0 + (dVar45 * dVar276) / 6.0 + auVar199._0_8_) -
                        auVar199._8_8_) - auVar277._8_8_) + auVar277._0_8_ + auVar306._0_8_) -
                     auVar306._8_8_) - auVar178._8_8_) + auVar178._0_8_ + auVar69._0_8_) -
                  auVar69._8_8_) - auVar125._8_8_;
      }
      dVar177 = dVar232 * dVar112 * dVar21;
      dVar276 = 0.0;
      if (dVar1 < local_d18) {
        dVar276 = (dVar121 + dVar338) * p->cam_beta * dVar102 * dVar120 +
                  dVar177 * 0.25 +
                  dVar55 * 0.75 * dVar56 + dVar37 * dVar103 + dVar52 * dVar55 * -0.25 + dVar151;
      }
      pdVar3 = out->v2rho2;
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
        lVar8 = (long)(p->dim).v2rho2 * sVar10;
        pdVar3[lVar8] =
             (dVar68 + dVar276) * __x_00 + dVar273 + dVar273 + dVar164 + dVar164 + pdVar3[lVar8];
      }
      dVar37 = 0.0;
      if (bVar5 && bVar4) {
        dVar37 = dVar20;
      }
      dVar68 = -0.0;
      if (dVar19 < dVar84) {
        dVar68 = (dVar22 * dVar57 * 0.4444444444444444 * dVar296 + dVar109 * dVar37) *
                 0.9847450218426964 * -0.375;
      }
      dVar90 = ((dVar37 * __x_00 + dVar296 + dVar57) * dVar269 * dVar93) / -6.0 +
               dVar93 * 1.2599210498948732 * 0.2222222222222222 * dVar303 * dVar58 * dVar297 +
               (dVar269 * dVar58 * dVar92 * dVar90 * -6.534776057350833 * dVar160 * dVar236) / 12.0;
      dVar160 = dVar34 * dVar206;
      dVar296 = dVar34 * dVar318;
      dVar37 = dVar95 * dVar318 * -4.0;
      dVar33 = -dVar33;
      dVar92 = -(dVar375 / dVar148);
      if (dVar187 < 1.35) {
        dVar90 = (double)(~uVar17 & (ulong)dVar90);
        dVar90 = dVar206 * -2.6666666666666665 * dVar272 +
                 dVar318 * -2.6666666666666665 * dVar315 +
                 dVar90 * -2.6666666666666665 * dVar32 +
                 dVar148 * -2.6666666666666665 *
                 ((dVar90 * dVar31 * dVar34 +
                  dVar252 * dVar90 +
                  dVar318 * dVar33 * dVar160 +
                  dVar37 * dVar206 +
                  dVar94 * dVar206 * dVar296 * 0.25 +
                  dVar375 * dVar206 * -2.0 * dVar296 + dVar237 * dVar90 * dVar34 * 0.5) * dVar96 +
                 dVar253 * dVar327 +
                 dVar59 * dVar270 +
                 (dVar90 + dVar90) * dVar149 +
                 dVar271 * dVar90 + dVar318 * dVar206 * dVar26 + dVar318 * dVar92 * dVar160 * 0.5);
      }
      else {
        dVar90 = (double)((ulong)dVar90 & uVar17);
        auVar131._0_8_ = dVar284 * local_5f8 * dVar212;
        auVar131._8_8_ = dVar90 * dVar231;
        auVar306 = divpd(auVar131,_DAT_00f54c60);
        auVar203._0_8_ = dVar90 * dVar213;
        auVar203._8_8_ = local_678 * local_5f8 * dVar212;
        auVar125 = divpd(auVar203,_DAT_00f54c70);
        auVar132._0_8_ = dStack_670 * local_5f8 * dVar212;
        auVar132._8_8_ = dVar90 * dVar311;
        auVar277 = divpd(auVar132,_DAT_00f54c80);
        auVar204._0_8_ = dVar90 * dVar299;
        auVar204._8_8_ = dVar208 * local_5f8 * dVar212;
        auVar178 = divpd(auVar204,_DAT_00f54c90);
        auVar133._0_8_ = dVar267 * local_5f8 * dVar212;
        auVar133._8_8_ = dVar90 * dVar184;
        auVar69 = divpd(auVar133,_DAT_00f54ca0);
        auVar226._0_8_ = dVar90 * dVar161;
        auVar226._8_8_ = dVar312 * local_5f8 * dVar212;
        auVar199 = divpd(auVar226,_DAT_00f54cb0);
        dVar90 = ((((((((((dVar90 * dVar298) / 240.0 +
                          (dVar251 * local_5f8 * dVar212) / -48.0 +
                          (dVar325 * dVar90) / -18.0 + (dVar150 * local_5f8 * dVar212) / 6.0 +
                         auVar306._0_8_) - auVar306._8_8_) - auVar125._8_8_) + auVar125._0_8_ +
                      auVar277._0_8_) - auVar277._8_8_) - auVar178._8_8_) + auVar178._0_8_ +
                   auVar69._0_8_) - auVar69._8_8_) - auVar199._8_8_) + auVar199._0_8_;
      }
      dVar303 = 0.0;
      if (bVar5 && bVar4) {
        dVar303 = dVar176;
      }
      dVar121 = -0.0;
      if (dVar185 < __x) {
        dVar121 = (dVar355 * dVar27 * 0.4444444444444444 * dVar239 + dVar303 * dVar314) *
                  0.9847450218426964 * -0.375;
      }
      dVar91 = dVar53 * dVar91 * 3.141592653589793 * dVar50;
      dVar53 = dVar373 * dVar62 * dVar91;
      dVar41 = ((dVar303 * __x_00 + dVar239 + dVar355) * dVar254) / -6.0 +
               dVar41 * 1.2599210498948732 * 0.2222222222222222 * dVar105 * dVar168 * dVar162 +
               (dVar162 * dVar53) / -12.0;
      dVar105 = dVar47 * dVar142;
      dVar239 = dVar47 * dVar255;
      dVar276 = dVar157 * dVar255 * -4.0;
      dVar46 = -dVar46;
      dVar303 = -(dVar302 / dVar35);
      if (dVar156 < 1.35) {
        dVar41 = (double)(~uVar12 & (ulong)dVar41);
        dVar338 = dVar255 * -2.6666666666666665 * dVar219 +
                  dVar41 * -2.6666666666666665 * dVar285 +
                  dVar35 * -2.6666666666666665 *
                  ((dVar41 * dVar44 * dVar47 +
                   dVar214 * dVar41 +
                   dVar255 * dVar46 * dVar105 +
                   dVar276 * dVar142 +
                   dVar99 * dVar142 * dVar239 * 0.25 +
                   dVar302 * dVar142 * -2.0 * dVar239 + dVar286 * dVar41 * dVar47 * 0.5) * dVar100 +
                  dVar215 * dVar169 +
                  dVar259 * dVar287 +
                  (dVar41 + dVar41) * dVar101 +
                  dVar256 * dVar41 + dVar255 * dVar142 * dVar358 + dVar255 * dVar303 * dVar105 * 0.5
                  );
        dVar41 = dVar142 * -2.6666666666666665 * dVar288;
      }
      else {
        dVar41 = (double)((ulong)dVar41 & uVar12);
        auVar134._0_8_ = dVar250 * dVar63 * local_608;
        auVar134._8_8_ = dVar41 * dVar335;
        auVar306 = divpd(auVar134,_DAT_00f54c60);
        auVar366._0_8_ = dVar41 * dVar326;
        auVar366._8_8_ = local_538 * dVar63 * local_608;
        auVar178 = divpd(auVar366,_DAT_00f54c70);
        auVar135._0_8_ = dStack_530 * dVar63 * local_608;
        auVar135._8_8_ = dVar41 * dVar372;
        auVar277 = divpd(auVar135,_DAT_00f54c80);
        auVar367._0_8_ = dVar41 * dVar363;
        auVar367._8_8_ = dVar295 * dVar63 * local_608;
        auVar199 = divpd(auVar367,_DAT_00f54c90);
        auVar136._0_8_ = dVar234 * dVar63 * local_608;
        auVar136._8_8_ = dVar41 * dVar362;
        auVar69 = divpd(auVar136,_DAT_00f54ca0);
        auVar345._0_8_ = dVar41 * dVar54;
        auVar345._8_8_ = dVar352 * dVar63 * local_608;
        auVar125 = divpd(auVar345,_DAT_00f54cb0);
        dVar338 = auVar125._0_8_;
        dVar41 = (((((((((dVar41 * dVar240) / 240.0 +
                         (dVar211 * dVar63 * local_608) / -48.0 +
                         (dVar163 * dVar41) / -18.0 + (dVar45 * dVar63 * local_608) / 6.0 +
                        auVar306._0_8_) - auVar306._8_8_) - auVar178._8_8_) + auVar178._0_8_ +
                     auVar277._0_8_) - auVar277._8_8_) - auVar199._8_8_) + auVar199._0_8_ +
                  auVar69._0_8_) - auVar69._8_8_) - auVar125._8_8_;
      }
      dVar122 = dVar216 * 0.375;
      dVar123 = dVar354 * dVar60 * dVar23;
      dVar339 = dVar21 * dVar316 * dVar232;
      dVar351 = dVar21 * dVar353 * dVar62 * dVar194;
      dVar305 = dVar55 * 0.375;
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
        lVar8 = (long)(p->dim).v2rho2 * sVar10;
        pdVar3[lVar8 + 1] =
             ((double)(~uVar16 &
                      (ulong)((dVar41 + dVar338) * p->cam_beta * dVar102 * dVar120 +
                             dVar339 * 0.125 +
                             dVar305 * dVar274 +
                             dVar112 * dVar114 * dVar120 +
                             dVar351 * -0.125 +
                             ((dVar177 * 0.125 +
                              dVar52 * dVar55 * -0.125 +
                              dVar56 * dVar220 * 0.375 +
                              dVar121 * dVar103 + dVar52 * dVar220 * -0.125 + dVar151) -
                             dVar305 * dVar170))) +
             (double)(~uVar15 &
                     (ulong)(dVar90 * p->cam_beta * dVar39 * dVar119 +
                            dVar110 * dVar60 * dVar119 +
                            dVar123 * 0.125 +
                            dVar195 * 0.375 * dVar165 +
                            dVar357 * 0.125 +
                            dVar361 * -0.125 +
                            dVar195 * dVar324 * -0.125 +
                            dVar111 * dVar122 +
                            ((dVar68 * dVar193 + dVar324 * dVar216 * -0.125) - dVar196 * dVar122) +
                            dVar329))) * __x_00 + dVar273 + dVar164 + dVar197 + dVar64 +
             pdVar3[lVar8 + 1];
      }
      dVar90 = 0.0;
      if (bVar5 && bVar4) {
        dVar90 = dVar20 + dVar49;
      }
      dVar20 = -0.0;
      if (dVar19 < dVar84) {
        dVar20 = (dVar109 * dVar90 + dVar22 * 0.4444444444444444 * dVar57 * dVar57) *
                 0.9847450218426964 * -0.375;
      }
      dVar19 = dVar93 * 0.2222222222222222 * dVar304 * dVar58 * dVar58 +
               (dVar93 * dVar269 * (dVar90 * __x_00 + dVar57 + dVar57)) / -6.0;
      if (dVar187 < 1.35) {
        dVar19 = (double)(~uVar17 & (ulong)dVar19);
        dVar22 = dVar206 * dVar206;
        dVar19 = dVar148 * -2.6666666666666665 *
                 ((dVar19 * dVar31 * dVar34 +
                  dVar252 * dVar19 +
                  dVar22 * dVar33 * dVar34 +
                  dVar22 * -4.0 * dVar95 +
                  dVar94 * dVar22 * dVar34 * 0.25 +
                  dVar29 * dVar22 * dVar34 + dVar237 * dVar19 * dVar34 * 0.5) * dVar96 +
                 dVar206 * 4.0 * dVar327 +
                 (dVar19 + dVar19) * dVar149 +
                 dVar271 * dVar19 + dVar22 * dVar92 * dVar34 * 0.5 + dVar26 * dVar22) +
                 dVar19 * -2.6666666666666665 * dVar32 + dVar206 * -5.333333333333333 * dVar315;
      }
      else {
        dVar22 = local_5f8 * local_5f8;
        dVar19 = (double)((ulong)dVar19 & uVar17);
        auVar293._0_8_ = dVar284 * dVar22;
        auVar293._8_8_ = dVar231 * dVar19;
        auVar199 = divpd(auVar293,_DAT_00f54c60);
        auVar280._0_8_ = dVar213 * dVar19;
        auVar280._8_8_ = local_678 * dVar22;
        auVar69 = divpd(auVar280,_DAT_00f54c70);
        auVar281._0_8_ = dStack_670 * dVar22;
        auVar281._8_8_ = dVar311 * dVar19;
        auVar125 = divpd(auVar281,_DAT_00f54c80);
        auVar282._0_8_ = dVar299 * dVar19;
        auVar282._8_8_ = dVar208 * dVar22;
        auVar178 = divpd(auVar282,_DAT_00f54c90);
        auVar245._0_8_ = dVar22 * dVar267;
        auVar245._8_8_ = dVar19 * dVar184;
        auVar306 = divpd(auVar245,_DAT_00f54ca0);
        auVar246._0_8_ = dVar161 * dVar19;
        auVar246._8_8_ = dVar312 * dVar22;
        auVar277 = divpd(auVar246,_DAT_00f54cb0);
        dVar19 = ((((((((((dVar19 * dVar298) / 240.0 +
                          (dVar251 * dVar22) / -48.0 +
                          (dVar325 * dVar19) / -18.0 + (dVar150 * dVar22) / 6.0 + auVar199._0_8_) -
                        auVar199._8_8_) - auVar69._8_8_) + auVar69._0_8_ + auVar125._0_8_) -
                     auVar125._8_8_) - auVar178._8_8_) + auVar178._0_8_ + auVar306._0_8_) -
                  auVar306._8_8_) - auVar277._8_8_) + auVar277._0_8_;
      }
      dVar84 = 0.0;
      dVar22 = 0.0;
      if (dVar340 < dVar18) {
        dVar22 = dVar19 * p->cam_beta * dVar39 * dVar119 +
                 dVar123 * 0.25 +
                 dVar329 + dVar216 * 0.75 * dVar165 + dVar20 * dVar193 + dVar324 * dVar216 * -0.25;
      }
      if (bVar5 && bVar4) {
        dVar84 = dVar176 - dVar49;
      }
      dVar19 = -0.0;
      if (dVar185 < __x) {
        dVar19 = (dVar314 * dVar84 + dVar27 * 0.4444444444444444 * dVar355 * dVar355) *
                 0.9847450218426964 * -0.375;
      }
      dVar20 = (dVar188 / dVar233) / (local_d18 * dVar98);
      dVar41 = ((pdVar2[1] / (dVar190 * dVar190)) / dVar190) * -2.0;
      dVar27 = local_bd0 * dVar65 * dVar166;
      dVar90 = dVar191 * (dVar258 / dVar210);
      dVar324 = dVar38 * dVar258 * dVar191 * 9.777777777777779 * (dVar152 / dVar233) +
                dVar90 * -14.222222222222221 * local_bd0 * local_bd0 * dVar143 * dVar20 +
                dVar257 * dVar217 * -5.333333333333333 * dVar27 +
                dVar257 * dVar257 * dVar154 * dVar41 +
                (dVar97 * 9.777777777777779 * (dVar152 / dVar233) +
                dVar209 * 33.77777777777778 * dVar20) * dVar217 * dVar154;
      dVar185 = 1.0 / (dVar167 * dVar167);
      dVar93 = 1.0 / (dVar192 * dVar167);
      dVar20 = dVar43 * (((((p->cam_omega / dVar155) / 14.234432706575232) / dVar85) / dVar373) /
                        3.0) * 9.869604401089358 * 1.125;
      dVar85 = dVar186 * dVar20 * dVar185 * 2.519842099789747;
      dVar218 = dVar93 * 1.5874010519681996 * dVar218;
      dVar84 = ((dVar84 * __x_00 + dVar355 + dVar355) * dVar254) / -6.0 +
               dVar42 * dVar168 * dVar168 +
               dVar374 * dVar324 * 0.25 +
               dVar62 * dVar62 * dVar218 * -0.5 +
               dVar85 * dVar62 * dVar62 + (dVar53 * dVar168) / -6.0;
      if (dVar156 < 1.35) {
        dVar84 = (double)(~uVar12 & (ulong)dVar84);
        dVar38 = dVar142 * dVar142;
        dVar84 = dVar35 * -2.6666666666666665 *
                 ((dVar84 * dVar44 * dVar47 +
                  dVar214 * dVar84 +
                  dVar38 * dVar46 * dVar47 +
                  dVar38 * -4.0 * dVar157 +
                  dVar99 * dVar38 * dVar47 * 0.25 +
                  dVar356 * dVar38 * dVar47 + dVar286 * dVar84 * dVar47 * 0.5) * dVar100 +
                 dVar142 * 4.0 * dVar169 +
                 (dVar84 + dVar84) * dVar101 +
                 dVar256 * dVar84 + dVar38 * dVar303 * dVar47 * 0.5 + dVar358 * dVar38) +
                 dVar84 * -2.6666666666666665 * dVar285 + dVar142 * -5.333333333333333 * dVar219;
      }
      else {
        dVar38 = dVar63 * dVar63;
        dVar84 = (double)((ulong)dVar84 & uVar12);
        auVar310._0_8_ = dVar250 * dVar38;
        auVar310._8_8_ = dVar335 * dVar84;
        auVar199 = divpd(auVar310,_DAT_00f54c60);
        auVar227._0_8_ = dVar326 * dVar84;
        auVar227._8_8_ = local_538 * dVar38;
        auVar69 = divpd(auVar227,_DAT_00f54c70);
        auVar228._0_8_ = dStack_530 * dVar38;
        auVar228._8_8_ = dVar372 * dVar84;
        auVar125 = divpd(auVar228,_DAT_00f54c80);
        auVar229._0_8_ = dVar363 * dVar84;
        auVar229._8_8_ = dVar295 * dVar38;
        auVar178 = divpd(auVar229,_DAT_00f54c90);
        auVar137._0_8_ = dVar38 * dVar234;
        auVar137._8_8_ = dVar84 * dVar362;
        auVar306 = divpd(auVar137,_DAT_00f54ca0);
        auVar138._0_8_ = dVar54 * dVar84;
        auVar138._8_8_ = dVar352 * dVar38;
        auVar277 = divpd(auVar138,_DAT_00f54cb0);
        dVar84 = ((((((((((dVar84 * dVar240) / 240.0 +
                          (dVar211 * dVar38) / -48.0 +
                          (dVar163 * dVar84) / -18.0 + (dVar45 * dVar38) / 6.0 + auVar199._0_8_) -
                        auVar199._8_8_) - auVar69._8_8_) + auVar69._0_8_ + auVar125._0_8_) -
                     auVar125._8_8_) - auVar178._8_8_) + auVar178._0_8_ + auVar306._0_8_) -
                  auVar306._8_8_) - auVar277._8_8_) + auVar277._0_8_;
      }
      dVar38 = 0.0;
      if (dVar1 < local_d18) {
        dVar38 = dVar84 * p->cam_beta * dVar102 * dVar120 +
                 dVar21 * 0.75 * dVar114 * dVar316 +
                 ((((dVar151 +
                    dVar220 * 0.75 * dVar274 +
                    ((dVar19 * dVar103 + dVar52 * dVar220 * -0.25) - dVar170 * dVar220 * 0.75)) -
                   dVar351 * 0.25) + dVar339 * 0.25) - dVar324 * dVar24 * dVar194 * dVar120);
      }
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
        lVar8 = (long)(p->dim).v2rho2 * sVar10;
        pdVar3[lVar8 + 2] =
             (dVar22 + dVar38) * __x_00 + dVar197 + dVar197 + dVar64 + dVar64 + pdVar3[lVar8 + 2];
      }
      dVar19 = dVar158 * dVar301;
      dVar22 = dVar25 * -2.6666666666666665 * dVar275 * dVar268 +
               dVar145 * 5.333333333333333 * dVar106 * dVar143 * dVar124 +
               dVar235 * dVar158 * dVar88 +
               dVar19 * -2.6666666666666665 * dVar86 +
               dVar89 * dVar301 * dVar242 * dVar235 +
               (pdVar2[2] * -2.6666666666666665 * dVar268 + dVar115 * -10.666666666666666 * dVar106)
               * dVar89 * dVar158;
      dVar84 = dVar313 * dVar50 * dVar159 * dVar221;
      dVar124 = dVar116 * dVar22 * 0.25 +
                dVar108 * dVar50 * dVar337 * dVar221 * dVar236 * -0.5 +
                dVar30 * dVar186 * 2.519842099789747 * dVar87 * dVar221 * dVar236 +
                (dVar297 * dVar84) / -12.0;
      dVar87 = dVar34 * dVar117;
      dVar86 = dVar375 * dVar117 * -2.0;
      if (dVar187 < 1.35) {
        dVar124 = (double)(~uVar17 & (ulong)dVar124);
        dVar124 = dVar117 * -2.6666666666666665 * dVar272 +
                  dVar318 * -2.6666666666666665 * dVar222 +
                  dVar124 * -2.6666666666666665 * dVar32 +
                  dVar148 * -2.6666666666666665 *
                  ((dVar124 * dVar31 * dVar34 +
                   dVar252 * dVar124 +
                   dVar318 * dVar33 * dVar87 +
                   dVar37 * dVar117 +
                   dVar296 * dVar94 * dVar117 * 0.25 +
                   dVar86 * dVar296 + dVar237 * dVar124 * dVar34 * 0.5) * dVar96 +
                  dVar253 * dVar317 +
                  dVar270 * dVar171 +
                  (dVar124 + dVar124) * dVar149 +
                  dVar271 * dVar124 + dVar318 * dVar117 * dVar26 + dVar318 * dVar92 * dVar87 * 0.5);
      }
      else {
        dVar124 = (double)((ulong)dVar124 & uVar17);
        auVar346._0_8_ = dVar284 * local_3f8 * dVar212;
        auVar346._8_8_ = dVar124 * dVar231;
        auVar277 = divpd(auVar346,_DAT_00f54c60);
        auVar347._0_8_ = dVar124 * dVar213;
        auVar347._8_8_ = local_678 * local_3f8 * dVar212;
        auVar69 = divpd(auVar347,_DAT_00f54c70);
        auVar348._0_8_ = dStack_670 * local_3f8 * dVar212;
        auVar348._8_8_ = dVar124 * dVar311;
        auVar125 = divpd(auVar348,_DAT_00f54c80);
        auVar349._0_8_ = dVar124 * dVar299;
        auVar349._8_8_ = dVar208 * local_3f8 * dVar212;
        auVar178 = divpd(auVar349,_DAT_00f54c90);
        auVar350._0_8_ = dVar267 * local_3f8 * dVar212;
        auVar350._8_8_ = dVar124 * dVar184;
        auVar199 = divpd(auVar350,_DAT_00f54ca0);
        auVar139._0_8_ = dVar124 * dVar161;
        auVar139._8_8_ = dVar312 * local_3f8 * dVar212;
        auVar306 = divpd(auVar139,_DAT_00f54cb0);
        dVar124 = ((((((((((dVar124 * dVar298) / 240.0 +
                           (dVar212 * dVar251 * local_3f8) / -48.0 +
                           (dVar325 * dVar124) / -18.0 + (dVar212 * dVar150 * local_3f8) / 6.0 +
                          auVar277._0_8_) - auVar277._8_8_) - auVar69._8_8_) + auVar69._0_8_ +
                       auVar125._0_8_) - auVar125._8_8_) - auVar178._8_8_) + auVar178._0_8_ +
                    auVar199._0_8_) - auVar199._8_8_) - auVar306._8_8_) + auVar306._0_8_;
      }
      dVar318 = dVar353 * dVar221 * dVar40 * dVar23 * 0.125;
      dVar30 = dVar354 * dVar173 * dVar23 * 0.125;
      dVar145 = 0.0;
      if (dVar340 < dVar18) {
        dVar145 = dVar124 * p->cam_beta * dVar39 * dVar119 +
                  dVar110 * dVar173 * dVar119 +
                  dVar195 * 0.375 * dVar198 +
                  dVar238 * dVar118 * dVar119 +
                  ((dVar195 * -0.375 * dVar260 - dVar318) - dVar22 * dVar24 * dVar40 * dVar119) +
                  dVar30;
      }
      pdVar3 = out->v2rhosigma;
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
        lVar8 = (long)(p->dim).v2rhosigma * sVar10;
        dVar124 = (pdVar3 + lVar8)[1];
        pdVar3[lVar8] = dVar145 * __x_00 + dVar172 + pdVar3[lVar8];
        (pdVar3 + lVar8)[1] = dVar124 + 0.0;
      }
      dVar91 = dVar91 * dVar373 * dVar174;
      dVar22 = (dVar162 * dVar91) / -12.0;
      dVar124 = dVar47 * dVar104;
      dVar145 = dVar302 * dVar104 * -2.0;
      if (dVar156 < 1.35) {
        dVar22 = (double)(~uVar12 & (ulong)dVar22);
        dVar22 = dVar104 * -2.6666666666666665 * dVar288 +
                 dVar255 * -2.6666666666666665 * dVar328 +
                 dVar22 * -2.6666666666666665 * dVar285 +
                 dVar35 * -2.6666666666666665 *
                 ((dVar22 * dVar44 * dVar47 +
                  dVar214 * dVar22 +
                  dVar255 * dVar46 * dVar124 +
                  dVar276 * dVar104 +
                  dVar239 * dVar99 * dVar104 * 0.25 +
                  dVar145 * dVar239 + dVar286 * dVar22 * dVar47 * 0.5) * dVar100 +
                 dVar215 * dVar241 +
                 dVar287 * dVar261 +
                 (dVar22 + dVar22) * dVar101 +
                 dVar256 * dVar22 + dVar255 * dVar104 * dVar358 + dVar255 * dVar303 * dVar124 * 0.5)
        ;
      }
      else {
        dVar22 = (double)((ulong)dVar22 & uVar12);
        auVar294._0_8_ = dVar250 * local_3e8 * local_608;
        auVar294._8_8_ = dVar22 * dVar335;
        auVar277 = divpd(auVar294,_DAT_00f54c60);
        auVar368._0_8_ = dVar22 * dVar326;
        auVar368._8_8_ = local_538 * local_3e8 * local_608;
        auVar178 = divpd(auVar368,_DAT_00f54c70);
        auVar323._0_8_ = dStack_530 * local_3e8 * local_608;
        auVar323._8_8_ = dVar22 * dVar372;
        auVar69 = divpd(auVar323,_DAT_00f54c80);
        auVar369._0_8_ = dVar22 * dVar363;
        auVar369._8_8_ = dVar295 * local_3e8 * local_608;
        auVar199 = divpd(auVar369,_DAT_00f54c90);
        auVar73._0_8_ = dVar234 * local_3e8 * local_608;
        auVar73._8_8_ = dVar22 * dVar362;
        auVar306 = divpd(auVar73,_DAT_00f54ca0);
        auVar360._0_8_ = dVar22 * dVar54;
        auVar360._8_8_ = dVar352 * local_3e8 * local_608;
        auVar125 = divpd(auVar360,_DAT_00f54cb0);
        dVar22 = ((((((((((dVar22 * dVar240) / 240.0 +
                          (local_608 * dVar211 * local_3e8) / -48.0 +
                          (dVar163 * dVar22) / -18.0 + (local_608 * dVar45 * local_3e8) / 6.0 +
                         auVar277._0_8_) - auVar277._8_8_) - auVar178._8_8_) + auVar178._0_8_ +
                      auVar69._0_8_) - auVar69._8_8_) - auVar199._8_8_) + auVar199._0_8_ +
                   auVar306._0_8_) - auVar306._8_8_) - auVar125._8_8_) + auVar125._0_8_;
      }
      dVar324 = dVar353 * dVar174 * dVar194 * dVar21 * 0.125;
      dVar232 = dVar232 * dVar290 * dVar21 * 0.125;
      dVar37 = 0.0;
      if (dVar1 < local_d18) {
        dVar37 = dVar22 * p->cam_beta * dVar102 * dVar120 +
                 dVar305 * dVar67 +
                 dVar112 * dVar66 * dVar120 + (dVar55 * -0.375 * dVar175 - dVar324) + dVar232;
      }
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
        lVar8 = (long)(p->dim).v2rhosigma * sVar10;
        pdVar3[lVar8 + 2] = dVar37 * __x_00 + dVar289 + pdVar3[lVar8 + 2];
      }
      dVar58 = (dVar58 * dVar84) / -12.0;
      if (dVar187 < 1.35) {
        dVar58 = (double)(~uVar17 & (ulong)dVar58);
        dVar58 = dVar117 * -2.6666666666666665 * dVar315 +
                 dVar206 * -2.6666666666666665 * dVar222 +
                 dVar58 * -2.6666666666666665 * dVar32 +
                 dVar148 * -2.6666666666666665 *
                 ((dVar58 * dVar31 * dVar34 +
                  dVar252 * dVar58 +
                  dVar206 * dVar33 * dVar87 +
                  dVar95 * dVar206 * -4.0 * dVar117 +
                  dVar94 * dVar117 * dVar160 * 0.25 +
                  dVar86 * dVar160 + dVar237 * dVar58 * dVar34 * 0.5) * dVar96 +
                 dVar59 * dVar317 +
                 dVar171 * dVar327 +
                 (dVar58 + dVar58) * dVar149 +
                 dVar271 * dVar58 + dVar206 * dVar117 * dVar26 + dVar206 * dVar92 * dVar87 * 0.5);
      }
      else {
        dVar58 = (double)((ulong)dVar58 & uVar17);
        auVar74._0_8_ = dVar284 * local_3f8 * local_5f8;
        auVar74._8_8_ = dVar58 * dVar231;
        auVar306 = divpd(auVar74,_DAT_00f54c60);
        auVar182._0_8_ = dVar58 * dVar213;
        auVar182._8_8_ = local_678 * local_3f8 * local_5f8;
        auVar125 = divpd(auVar182,_DAT_00f54c70);
        auVar75._0_8_ = dStack_670 * local_3f8 * local_5f8;
        auVar75._8_8_ = dVar58 * dVar311;
        auVar277 = divpd(auVar75,_DAT_00f54c80);
        auVar183._0_8_ = dVar58 * dVar299;
        auVar183._8_8_ = dVar208 * local_3f8 * local_5f8;
        auVar178 = divpd(auVar183,_DAT_00f54c90);
        auVar76._0_8_ = dVar267 * local_3f8 * local_5f8;
        auVar76._8_8_ = dVar58 * dVar184;
        auVar69 = divpd(auVar76,_DAT_00f54ca0);
        auVar247._0_8_ = dVar58 * dVar161;
        auVar247._8_8_ = dVar312 * local_3f8 * local_5f8;
        auVar199 = divpd(auVar247,_DAT_00f54cb0);
        dVar58 = ((((((((((dVar58 * dVar298) / 240.0 +
                          (dVar251 * local_3f8 * local_5f8) / -48.0 +
                          (dVar325 * dVar58) / -18.0 + (dVar150 * local_3f8 * local_5f8) / 6.0 +
                         auVar306._0_8_) - auVar306._8_8_) - auVar125._8_8_) + auVar125._0_8_ +
                      auVar277._0_8_) - auVar277._8_8_) - auVar178._8_8_) + auVar178._0_8_ +
                   auVar69._0_8_) - auVar69._8_8_) - auVar199._8_8_) + auVar199._0_8_;
      }
      dVar22 = 0.0;
      if (dVar340 < dVar18) {
        dVar22 = dVar58 * p->cam_beta * dVar39 * dVar119 +
                 dVar122 * dVar198 +
                 dVar60 * dVar118 * dVar119 + (dVar216 * -0.375 * dVar260 - dVar318) + dVar30;
      }
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
        lVar8 = (long)(p->dim).v2rhosigma * sVar10;
        dVar58 = (pdVar3 + lVar8 + 3)[1];
        pdVar3[lVar8 + 3] = dVar22 * __x_00 + dVar172 + pdVar3[lVar8 + 3];
        (pdVar3 + lVar8 + 3)[1] = dVar58 + 0.0;
      }
      dVar58 = dVar217 * dVar336;
      dVar22 = dVar191 * -2.6666666666666665 * dVar65 * dVar166 +
               dVar90 * 5.333333333333333 * dVar61 * dVar143 * local_bd0 +
               dVar257 * dVar217 * dVar153 +
               dVar58 * -2.6666666666666665 * dVar27 +
               dVar154 * dVar336 * dVar41 * dVar257 +
               (pdVar2[2] * -2.6666666666666665 * dVar166 + dVar300 * -10.666666666666666 * dVar61)
               * dVar154 * dVar217;
      dVar27 = dVar374 * dVar22 * 0.25 +
               dVar50 * dVar113 * dVar93 * dVar174 * dVar62 * -0.5 +
               dVar186 * 2.519842099789747 * dVar20 * dVar185 * dVar174 * dVar62 +
               (dVar168 * dVar91) / -12.0;
      if (dVar156 < 1.35) {
        dVar27 = (double)(~uVar12 & (ulong)dVar27);
        dVar124 = dVar104 * -2.6666666666666665 * dVar219 +
                  dVar142 * -2.6666666666666665 * dVar328 +
                  dVar27 * -2.6666666666666665 * dVar285 +
                  dVar35 * -2.6666666666666665 *
                  ((dVar27 * dVar44 * dVar47 +
                   dVar214 * dVar27 +
                   dVar142 * dVar46 * dVar124 +
                   dVar157 * dVar142 * -4.0 * dVar104 +
                   dVar99 * dVar104 * dVar105 * 0.25 +
                   dVar145 * dVar105 + dVar286 * dVar27 * dVar47 * 0.5) * dVar100 +
                  dVar259 * dVar241 +
                  dVar261 * dVar169 +
                  (dVar27 + dVar27) * dVar101 +
                  dVar256 * dVar27 + dVar142 * dVar104 * dVar358 + dVar142 * dVar303 * dVar124 * 0.5
                  );
      }
      else {
        dVar27 = (double)((ulong)dVar27 & uVar12);
        auVar77._0_8_ = dVar250 * local_3e8 * dVar63;
        auVar77._8_8_ = dVar27 * dVar335;
        auVar306 = divpd(auVar77,_DAT_00f54c60);
        auVar248._0_8_ = dVar27 * dVar326;
        auVar248._8_8_ = local_538 * local_3e8 * dVar63;
        auVar178 = divpd(auVar248,_DAT_00f54c70);
        auVar78._0_8_ = dStack_530 * local_3e8 * dVar63;
        auVar78._8_8_ = dVar27 * dVar372;
        auVar277 = divpd(auVar78,_DAT_00f54c80);
        auVar249._0_8_ = dVar27 * dVar363;
        auVar249._8_8_ = dVar295 * local_3e8 * dVar63;
        auVar199 = divpd(auVar249,_DAT_00f54c90);
        auVar79._0_8_ = dVar234 * local_3e8 * dVar63;
        auVar79._8_8_ = dVar27 * dVar362;
        auVar69 = divpd(auVar79,_DAT_00f54ca0);
        auVar230._0_8_ = dVar27 * dVar54;
        auVar230._8_8_ = dVar352 * local_3e8 * dVar63;
        auVar125 = divpd(auVar230,_DAT_00f54cb0);
        dVar124 = ((((((((((dVar27 * dVar240) / 240.0 +
                           (dVar211 * local_3e8 * dVar63) / -48.0 +
                           (dVar163 * dVar27) / -18.0 + (dVar45 * local_3e8 * dVar63) / 6.0 +
                          auVar306._0_8_) - auVar306._8_8_) - auVar178._8_8_) + auVar178._0_8_ +
                       auVar277._0_8_) - auVar277._8_8_) - auVar199._8_8_) + auVar199._0_8_ +
                    auVar69._0_8_) - auVar69._8_8_) - auVar125._8_8_) + auVar125._0_8_;
      }
      dVar27 = 0.0;
      if (dVar1 < local_d18) {
        dVar27 = dVar124 * p->cam_beta * dVar102 * dVar120 +
                 dVar114 * dVar290 * dVar120 +
                 dVar232 + dVar220 * 0.375 * dVar67 +
                           dVar316 * dVar66 * dVar120 +
                           ((dVar220 * -0.375 * dVar175 - dVar324) -
                           dVar22 * dVar24 * dVar194 * dVar120);
      }
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
        lVar8 = (long)(p->dim).v2rhosigma * sVar10;
        pdVar3[lVar8 + 5] = dVar27 * __x_00 + dVar289 + pdVar3[lVar8 + 5];
      }
      dVar124 = pdVar2[3];
      dVar22 = dVar25 * -2.0 * (dVar107 / dVar147) * dVar143 * dVar144 +
               (dVar158 + dVar158) * dVar144 * dVar124 * dVar89 +
               (dVar19 + dVar19) * dVar88 + dVar301 * dVar301 * dVar89 * dVar242;
      dVar19 = dVar116 * dVar22 * 0.25 +
               dVar146 * dVar207 * dVar221 * dVar221 + dVar28 * dVar51 * dVar221 * dVar221 * -0.5;
      if (dVar187 < 1.35) {
        dVar19 = (double)(~uVar17 & (ulong)dVar19);
        dVar25 = dVar117 * dVar117;
        dVar19 = dVar148 * -2.6666666666666665 *
                 (dVar96 * (dVar31 * dVar19 * dVar34 +
                           dVar252 * dVar19 +
                           dVar33 * dVar25 * dVar34 +
                           dVar25 * -4.0 * dVar95 +
                           dVar94 * dVar25 * dVar34 * 0.25 +
                           dVar29 * dVar25 * dVar34 + dVar237 * dVar19 * dVar34 * 0.5) +
                 dVar117 * 4.0 * dVar317 +
                 (dVar19 + dVar19) * dVar149 +
                 dVar271 * dVar19 + dVar26 * dVar25 + dVar92 * dVar25 * dVar34 * 0.5) +
                 dVar19 * -2.6666666666666665 * dVar32 + dVar117 * -5.333333333333333 * dVar222;
      }
      else {
        dVar19 = (double)(uVar17 & (ulong)dVar19);
        local_3f8 = local_3f8 * local_3f8;
        auVar80._0_8_ = dVar284 * local_3f8;
        auVar80._8_8_ = dVar231 * dVar19;
        auVar306 = divpd(auVar80,_DAT_00f54c60);
        auVar81._0_8_ = dVar213 * dVar19;
        auVar81._8_8_ = local_678 * local_3f8;
        auVar277 = divpd(auVar81,_DAT_00f54c70);
        auVar370._0_8_ = dStack_670 * local_3f8;
        auVar370._8_8_ = dVar311 * dVar19;
        auVar178 = divpd(auVar370,_DAT_00f54c80);
        auVar377._0_8_ = dVar299 * dVar19;
        auVar377._8_8_ = dVar208 * local_3f8;
        auVar199 = divpd(auVar377,_DAT_00f54c90);
        auVar82._0_8_ = dVar267 * local_3f8;
        auVar82._8_8_ = dVar184 * dVar19;
        auVar69 = divpd(auVar82,_DAT_00f54ca0);
        auVar83._0_8_ = dVar161 * dVar19;
        auVar83._8_8_ = dVar312 * local_3f8;
        auVar125 = divpd(auVar83,_DAT_00f54cb0);
        dVar19 = ((((((((((dVar298 * dVar19) / 240.0 +
                          (dVar251 * local_3f8) / -48.0 +
                          (dVar325 * dVar19) / -18.0 + (dVar150 * local_3f8) / 6.0 + auVar306._0_8_)
                        - auVar306._8_8_) - auVar277._8_8_) + auVar277._0_8_ + auVar178._0_8_) -
                     auVar178._8_8_) - auVar199._8_8_) + auVar199._0_8_ + auVar69._0_8_) -
                  auVar69._8_8_) - auVar125._8_8_) + auVar125._0_8_;
      }
      dVar25 = 0.0;
      if (dVar340 < dVar18) {
        dVar25 = dVar119 * dVar39 * dVar19 * p->cam_beta +
                 dVar36 * dVar40 * dVar22 * dVar24 + dVar23 * 0.75 * dVar118 * dVar173;
      }
      pdVar3 = out->v2sigma2;
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
        lVar8 = (long)(p->dim).v2sigma2 * sVar10;
        dVar18 = (pdVar3 + lVar8)[1];
        dVar340 = pdVar3[lVar8 + 2];
        dVar124 = (pdVar3 + lVar8 + 2)[1];
        pdVar3[lVar8] = pdVar3[lVar8] + dVar25 * __x_00;
        (pdVar3 + lVar8)[1] = dVar18 + 0.0;
        pdVar3[lVar8 + 2] = dVar340 + 0.0;
        (pdVar3 + lVar8 + 2)[1] = dVar124 + 0.0;
        pdVar3[lVar8 + 4] = pdVar3[lVar8 + 4] + 0.0;
        dVar124 = pdVar2[3];
      }
      dVar18 = (dVar217 + dVar217) * dVar124 * dVar189 * dVar154 +
               (dVar58 + dVar58) * dVar153 +
               dVar41 * dVar336 * dVar336 * dVar154 +
               dVar191 * -2.0 * (dVar258 / dVar210) * dVar143 * dVar189;
      dVar340 = dVar374 * dVar18 * 0.25 +
                dVar85 * dVar174 * dVar174 + dVar218 * dVar174 * dVar174 * -0.5;
      if (dVar156 < 1.35) {
        dVar340 = (double)(~uVar12 & (ulong)dVar340);
        dVar124 = dVar104 * dVar104;
        dVar340 = dVar35 * -2.6666666666666665 *
                  (dVar100 * (dVar44 * dVar340 * dVar47 +
                             dVar214 * dVar340 +
                             dVar46 * dVar124 * dVar47 +
                             dVar124 * -4.0 * dVar157 +
                             dVar99 * dVar124 * dVar47 * 0.25 +
                             dVar356 * dVar124 * dVar47 + dVar286 * dVar340 * dVar47 * 0.5) +
                  dVar104 * 4.0 * dVar241 +
                  (dVar340 + dVar340) * dVar101 +
                  dVar256 * dVar340 + dVar358 * dVar124 + dVar303 * dVar124 * dVar47 * 0.5) +
                  dVar340 * -2.6666666666666665 * dVar285 + dVar104 * -5.333333333333333 * dVar328;
      }
      else {
        dVar340 = (double)(uVar12 & (ulong)dVar340);
        local_3e8 = local_3e8 * local_3e8;
        auVar140._0_8_ = dVar250 * local_3e8;
        auVar140._8_8_ = dVar335 * dVar340;
        auVar306 = divpd(auVar140,_DAT_00f54c60);
        auVar378._0_8_ = dVar326 * dVar340;
        auVar378._8_8_ = local_538 * local_3e8;
        auVar199 = divpd(auVar378,_DAT_00f54c70);
        auVar283._0_8_ = dStack_530 * local_3e8;
        auVar283._8_8_ = dVar372 * dVar340;
        auVar125 = divpd(auVar283,_DAT_00f54c80);
        auVar205._0_8_ = dVar363 * dVar340;
        auVar205._8_8_ = dVar295 * local_3e8;
        auVar69 = divpd(auVar205,_DAT_00f54c90);
        auVar371._0_8_ = dVar234 * local_3e8;
        auVar371._8_8_ = dVar362 * dVar340;
        auVar178 = divpd(auVar371,_DAT_00f54ca0);
        auVar141._0_8_ = dVar54 * dVar340;
        auVar141._8_8_ = dVar352 * local_3e8;
        auVar277 = divpd(auVar141,_DAT_00f54cb0);
        dVar340 = ((((((((((dVar240 * dVar340) / 240.0 +
                           (dVar211 * local_3e8) / -48.0 +
                           (dVar163 * dVar340) / -18.0 + (dVar45 * local_3e8) / 6.0 + auVar306._0_8_
                          ) - auVar306._8_8_) - auVar199._8_8_) + auVar199._0_8_ + auVar125._0_8_) -
                      auVar125._8_8_) - auVar69._8_8_) + auVar69._0_8_ + auVar178._0_8_) -
                   auVar178._8_8_) - auVar277._8_8_) + auVar277._0_8_;
      }
      dVar124 = 0.0;
      if (dVar1 < local_d18) {
        dVar124 = dVar120 * dVar102 * dVar340 * p->cam_beta +
                  dVar48 * dVar194 * dVar24 * dVar18 + dVar21 * 0.75 * dVar66 * dVar290;
      }
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
        lVar8 = (long)(p->dim).v2sigma2 * sVar10;
        pdVar3[lVar8 + 5] = __x_00 * dVar124 + pdVar3[lVar8 + 5];
      }
    }
  }
  return;
}

Assistant:

static void
WORK_GGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, const double *sigma,
         xc_gga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};
  double my_sigma[3] = {0.0, 0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));
    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, out);
    
    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 %le 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(sigma, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le %le %le %le 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1),
                 VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2));
        }
      }
    }
#endif
  }   /* for(ip) */

}